

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::averageDownCoeffsSameAmrLevel
          (MLABecLaplacian *this,int amrlev,
          Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a,
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  initializer_list<const_amrex::MultiFab_*> iVar7;
  initializer_list<amrex::MultiFab_*> iVar8;
  BATType BVar9;
  int iVar10;
  bool bVar11;
  Long LVar12;
  IntVect *pIVar13;
  BATOp *pBVar14;
  long lVar15;
  int in_ESI;
  MFIter *in_RDI;
  Box t_zbx;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  Box t_ybx;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  Box t_xbx;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<const_int> *osm;
  Array4<double> *bz;
  Array4<double> *by;
  Array4<double> *bx;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  MFIter mfi;
  int ncomp;
  Real osfac;
  Real fac;
  int mglev_1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> crse;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> fine;
  IntVect ratio;
  int mglev;
  int nmglevs;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 hi_1;
  Dim3 lo_1;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 hi_2;
  Dim3 lo_2;
  Box *in_stack_fffffffffffff708;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff710;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff718;
  size_type in_stack_fffffffffffff720;
  undefined1 *in_stack_fffffffffffff730;
  FabArrayBase *in_stack_fffffffffffff738;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff748;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_fffffffffffff750;
  int in_stack_fffffffffffff77c;
  MFIter *in_stack_fffffffffffff780;
  undefined1 local_868 [40];
  undefined1 *local_840;
  undefined1 local_834 [52];
  iterator local_800;
  undefined1 local_7e8 [40];
  undefined1 *local_7c0;
  undefined1 local_7b4 [52];
  iterator local_780;
  undefined1 local_768 [40];
  undefined1 *local_740;
  long local_738 [8];
  long *local_6f8;
  long local_6f0 [8];
  long *local_6b0;
  long local_6a8 [8];
  long *local_668;
  long local_660 [8];
  long *local_620;
  undefined1 local_614 [28];
  undefined1 *local_5f8;
  undefined1 local_5ec [28];
  undefined1 *local_5d0;
  undefined1 local_5c4 [28];
  undefined1 *local_5a8;
  MFIter local_5a0;
  int local_53c;
  double local_538;
  double local_530;
  int local_528;
  reference local_520;
  reference local_518;
  reference local_510;
  reference *local_508;
  undefined8 local_500;
  undefined1 local_4c9;
  reference local_4c8;
  reference local_4c0;
  reference local_4b8;
  reference *local_4b0;
  undefined8 local_4a8;
  IntVect local_484;
  int local_478;
  int local_474;
  int local_45c;
  int local_450;
  int local_44c;
  BATType local_448;
  int local_444;
  undefined8 local_440;
  int local_438;
  undefined8 local_42c;
  int local_424;
  _func_int **local_420;
  BATType local_418;
  _func_int **local_410;
  BATType local_408;
  double local_400;
  int local_3f4;
  long *local_3f0;
  long *local_3e8;
  FabArray<amrex::FArrayBox> *local_3e0;
  int local_3d8;
  int local_3d4;
  BATType local_3d0;
  int local_3cc;
  undefined8 local_3c8;
  int local_3c0;
  undefined8 local_3b4;
  int local_3ac;
  _func_int **local_3a8;
  BATType local_3a0;
  _func_int **local_398;
  BATType local_390;
  double local_388;
  int local_37c;
  long *local_378;
  long *local_370;
  FabArray<amrex::FArrayBox> *local_368;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  undefined8 local_350;
  int local_348;
  undefined8 local_33c;
  int local_334;
  undefined8 local_330;
  int local_328;
  undefined8 local_320;
  int local_318;
  IntVect *in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  MultiFab *in_stack_fffffffffffffd00;
  MultiFab *in_stack_fffffffffffffd08;
  
  local_45c = in_ESI;
  LVar12 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x1550400);
  local_474 = (int)LVar12;
  for (local_478 = 1; local_478 < local_474; local_478 = local_478 + 1) {
    if (local_45c < 1) {
      pIVar13 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                          ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                           in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
      local_484.vect._0_8_ = *(undefined8 *)pIVar13->vect;
      local_484.vect[2] = pIVar13->vect[2];
    }
    else {
      IntVect::IntVect(&local_484,2);
    }
    if ((*(double *)&in_RDI[8].endIndex != 0.0) || (NAN(*(double *)&in_RDI[8].endIndex))) {
      in_stack_fffffffffffff738 =
           (FabArrayBase *)
           Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
      Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
      average_down(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    }
    else {
      Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff710,(value_type)in_stack_fffffffffffff708);
    }
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    local_4c8 = std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                           (size_type)in_stack_fffffffffffff708);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    local_4c0 = std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                           (size_type)in_stack_fffffffffffff708);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    local_4b8 = std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                           (size_type)in_stack_fffffffffffff708);
    local_4b0 = &local_4c8;
    local_4a8 = 3;
    in_stack_fffffffffffff730 = &local_4c9;
    std::allocator<const_amrex::MultiFab_*>::allocator
              ((allocator<const_amrex::MultiFab_*> *)0x15505b8);
    iVar7._M_len = in_stack_fffffffffffff720;
    iVar7._M_array = (iterator)in_stack_fffffffffffff718;
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff710,iVar7,(allocator_type *)in_stack_fffffffffffff708);
    std::allocator<const_amrex::MultiFab_*>::~allocator
              ((allocator<const_amrex::MultiFab_*> *)0x15505e9);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    local_520 = std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                           (size_type)in_stack_fffffffffffff708);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    local_518 = std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                           (size_type)in_stack_fffffffffffff708);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    local_510 = std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                           (size_type)in_stack_fffffffffffff708);
    local_508 = &local_520;
    local_500 = 3;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x1550694);
    iVar8._M_len = in_stack_fffffffffffff720;
    iVar8._M_array = (iterator)in_stack_fffffffffffff718;
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff710,iVar8,(allocator_type *)in_stack_fffffffffffff708);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x15506c5);
    average_down_faces(in_stack_fffffffffffff750,in_stack_fffffffffffff748,(IntVect *)in_RDI,
                       (int)((ulong)in_stack_fffffffffffff738 >> 0x20));
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x15506f3);
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               0x1550700);
  }
  for (local_528 = 1; local_528 < local_474; local_528 = local_528 + 1) {
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
    bVar11 = std::unique_ptr::operator_cast_to_bool
                       ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                        0x15507e2);
    if (bVar11) {
      local_530 = (double)(1 << ((byte)local_528 & 0x1f));
      local_538 = (local_530 * 2.0) / (local_530 + 1.0);
      local_53c = (**(code **)((long)&((in_RDI->m_fa)._M_t.
                                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                      _M_head_impl)->boxarray + 0x20))();
      Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
      TilingIfNotGPU();
      MFIter::MFIter(in_RDI,in_stack_fffffffffffff738,
                     SUB81((ulong)in_stack_fffffffffffff730 >> 0x38,0));
      while (bVar11 = MFIter::isValid(&local_5a0), bVar11) {
        MFIter::nodaltilebox(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
        local_5a8 = local_5c4;
        MFIter::nodaltilebox(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
        local_5d0 = local_5ec;
        MFIter::nodaltilebox(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
        local_5f8 = local_614;
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                   (size_type)in_stack_fffffffffffff708);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff718,(MFIter *)in_stack_fffffffffffff710);
        local_620 = local_660;
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                   (size_type)in_stack_fffffffffffff708);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff718,(MFIter *)in_stack_fffffffffffff710);
        local_668 = local_6a8;
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff710,
                   (size_type)in_stack_fffffffffffff708);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff718,(MFIter *)in_stack_fffffffffffff710);
        local_6b0 = local_6f0;
        Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                      *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
        Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                      *)in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
        std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                  ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x1550a2a
                  );
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff718,
                   (MFIter *)in_stack_fffffffffffff710);
        local_6f8 = local_738;
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff710);
        local_740 = local_768;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff710);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff710);
        while (bVar11 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_780,(iterator *)(local_7b4 + 0x1c)), bVar11) {
          in_stack_fffffffffffff718 = (FabArray<amrex::FArrayBox> *)local_7b4;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff718,&local_780);
          local_3e8 = local_620;
          local_3f0 = local_6f8;
          local_3f4 = local_53c;
          local_400 = local_538;
          iVar3 = *(int *)&(in_stack_fffffffffffff718->super_FabArrayBase)._vptr_FabArrayBase;
          iVar4 = *(int *)((long)&(in_stack_fffffffffffff718->super_FabArrayBase)._vptr_FabArrayBase
                          + 4);
          local_420 = (in_stack_fffffffffffff718->super_FabArrayBase)._vptr_FabArrayBase;
          local_418 = (in_stack_fffffffffffff718->super_FabArrayBase).boxarray.m_bat.m_bat_type;
          pBVar14 = &(in_stack_fffffffffffff718->super_FabArrayBase).boxarray.m_bat.m_op;
          uVar1 = (pBVar14->m_indexType).m_typ.itype;
          uVar2 = (in_stack_fffffffffffff718->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                  m_typ.itype;
          local_440 = *(undefined8 *)pBVar14;
          local_438 = (in_stack_fffffffffffff718->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg
                      .m_crse_ratio.vect[0];
          for (local_444 = 0; BVar9 = local_418, local_444 < local_53c; local_444 = local_444 + 1) {
            while (local_448 = BVar9, iVar5 = iVar4, (int)local_448 <= local_438) {
              while (local_44c = iVar5, iVar5 = iVar3, local_44c <= (int)uVar2) {
                while (local_450 = iVar5, local_450 <= (int)uVar1) {
                  if (*(int *)(*local_6f8 +
                              ((long)((local_450 + -1) - (int)local_6f8[4]) +
                               (long)(local_44c - *(int *)((long)local_6f8 + 0x24)) * local_6f8[1] +
                              (long)(int)(local_448 - (int)local_6f8[5]) * local_6f8[2]) * 4) +
                      *(int *)(*local_6f8 +
                              ((long)(local_450 - (int)local_6f8[4]) +
                               (long)(local_44c - *(int *)((long)local_6f8 + 0x24)) * local_6f8[1] +
                              (long)(int)(local_448 - (int)local_6f8[5]) * local_6f8[2]) * 4) == 1)
                  {
                    lVar15 = (long)(local_450 - (int)local_620[4]) +
                             (long)(local_44c - *(int *)((long)local_620 + 0x24)) * local_620[1] +
                             (long)(int)(local_448 - (int)local_620[5]) * local_620[2] +
                             (long)local_444 * local_620[3];
                    *(double *)(*local_620 + lVar15 * 8) =
                         local_538 * *(double *)(*local_620 + lVar15 * 8);
                  }
                  iVar5 = local_450 + 1;
                }
                iVar5 = local_44c + 1;
              }
              BVar9 = local_448 + indexType;
            }
          }
          local_42c = local_440;
          local_424 = local_438;
          local_410 = local_420;
          local_408 = local_418;
          local_3e0 = in_stack_fffffffffffff718;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_780);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff710);
        local_7c0 = local_7e8;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff710);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff710);
        while (bVar11 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_800,(iterator *)(local_834 + 0x1c)), bVar11) {
          in_stack_fffffffffffff710 = (FabArray<amrex::FArrayBox> *)local_834;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff710,&local_800);
          local_370 = local_668;
          local_378 = local_6f8;
          local_37c = local_53c;
          local_388 = local_538;
          iVar3 = *(int *)&(in_stack_fffffffffffff710->super_FabArrayBase)._vptr_FabArrayBase;
          iVar4 = *(int *)((long)&(in_stack_fffffffffffff710->super_FabArrayBase)._vptr_FabArrayBase
                          + 4);
          local_3a8 = (in_stack_fffffffffffff710->super_FabArrayBase)._vptr_FabArrayBase;
          local_3a0 = (in_stack_fffffffffffff710->super_FabArrayBase).boxarray.m_bat.m_bat_type;
          pBVar14 = &(in_stack_fffffffffffff710->super_FabArrayBase).boxarray.m_bat.m_op;
          uVar1 = (pBVar14->m_indexType).m_typ.itype;
          uVar2 = (in_stack_fffffffffffff710->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                  m_typ.itype;
          local_3c8 = *(undefined8 *)pBVar14;
          local_3c0 = (in_stack_fffffffffffff710->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg
                      .m_crse_ratio.vect[0];
          for (local_3cc = 0; BVar9 = local_3a0, local_3cc < local_53c; local_3cc = local_3cc + 1) {
            while (local_3d0 = BVar9, iVar5 = iVar4, (int)local_3d0 <= local_3c0) {
              while (local_3d4 = iVar5, iVar5 = iVar3, local_3d4 <= (int)uVar2) {
                while (local_3d8 = iVar5, local_3d8 <= (int)uVar1) {
                  if (*(int *)(*local_6f8 +
                              ((long)(local_3d8 - (int)local_6f8[4]) +
                               (long)((local_3d4 + -1) - *(int *)((long)local_6f8 + 0x24)) *
                               local_6f8[1] +
                              (long)(int)(local_3d0 - (int)local_6f8[5]) * local_6f8[2]) * 4) +
                      *(int *)(*local_6f8 +
                              ((long)(local_3d8 - (int)local_6f8[4]) +
                               (long)(local_3d4 - *(int *)((long)local_6f8 + 0x24)) * local_6f8[1] +
                              (long)(int)(local_3d0 - (int)local_6f8[5]) * local_6f8[2]) * 4) == 1)
                  {
                    lVar15 = (long)(local_3d8 - (int)local_668[4]) +
                             (long)(local_3d4 - *(int *)((long)local_668 + 0x24)) * local_668[1] +
                             (long)(int)(local_3d0 - (int)local_668[5]) * local_668[2] +
                             (long)local_3cc * local_668[3];
                    *(double *)(*local_668 + lVar15 * 8) =
                         local_538 * *(double *)(*local_668 + lVar15 * 8);
                  }
                  iVar5 = local_3d8 + 1;
                }
                iVar5 = local_3d4 + 1;
              }
              BVar9 = local_3d0 + indexType;
            }
          }
          local_3b4 = local_3c8;
          local_3ac = local_3c0;
          local_398 = local_3a8;
          local_390 = local_3a0;
          local_368 = in_stack_fffffffffffff710;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_800);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff710);
        local_840 = local_868;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff710);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff710);
        while (bVar11 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  ((iterator *)&stack0xfffffffffffff780,
                                   (iterator *)&stack0xfffffffffffff768), bVar11) {
          in_stack_fffffffffffff708 = (Box *)&stack0xfffffffffffff74c;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    (in_stack_fffffffffffff708,(iterator *)&stack0xfffffffffffff780);
          iVar3 = (in_stack_fffffffffffff708->smallend).vect[0];
          iVar4 = (in_stack_fffffffffffff708->smallend).vect[1];
          local_330 = *(undefined8 *)(in_stack_fffffffffffff708->smallend).vect;
          local_328 = (in_stack_fffffffffffff708->smallend).vect[2];
          iVar5 = (in_stack_fffffffffffff708->bigend).vect[0];
          iVar6 = (in_stack_fffffffffffff708->bigend).vect[1];
          local_350 = *(undefined8 *)(in_stack_fffffffffffff708->bigend).vect;
          local_348 = (in_stack_fffffffffffff708->bigend).vect[2];
          for (local_354 = 0; iVar10 = local_328, local_354 < local_53c; local_354 = local_354 + 1)
          {
            while (local_358 = iVar10, iVar10 = iVar4, local_358 <= local_348) {
              while (local_35c = iVar10, iVar10 = iVar3, local_35c <= iVar6) {
                while (local_360 = iVar10, local_360 <= iVar5) {
                  if (*(int *)(*local_6f8 +
                              ((long)(local_360 - (int)local_6f8[4]) +
                               (long)(local_35c - *(int *)((long)local_6f8 + 0x24)) * local_6f8[1] +
                              (long)((local_358 + -1) - (int)local_6f8[5]) * local_6f8[2]) * 4) +
                      *(int *)(*local_6f8 +
                              ((long)(local_360 - (int)local_6f8[4]) +
                               (long)(local_35c - *(int *)((long)local_6f8 + 0x24)) * local_6f8[1] +
                              (long)(local_358 - (int)local_6f8[5]) * local_6f8[2]) * 4) == 1) {
                    lVar15 = (long)(local_360 - (int)local_6b0[4]) +
                             (long)(local_35c - *(int *)((long)local_6b0 + 0x24)) * local_6b0[1] +
                             (long)(local_358 - (int)local_6b0[5]) * local_6b0[2] +
                             (long)local_354 * local_6b0[3];
                    *(double *)(*local_6b0 + lVar15 * 8) =
                         local_538 * *(double *)(*local_6b0 + lVar15 * 8);
                  }
                  iVar10 = local_360 + 1;
                }
                iVar10 = local_35c + 1;
              }
              iVar10 = local_358 + 1;
            }
          }
          local_33c = local_350;
          local_334 = local_348;
          local_320 = local_330;
          local_318 = local_328;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++
                    ((iterator *)&stack0xfffffffffffff780);
        }
        MFIter::operator++(&local_5a0);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffff710);
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::averageDownCoeffsSameAmrLevel (int amrlev, Vector<MultiFab>& a,
                                                Vector<Array<MultiFab,AMREX_SPACEDIM> >& b)
{
    int nmglevs = a.size();
    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[mglev-1];

        if (m_a_scalar == 0.0)
        {
            a[mglev].setVal(0.0);
        }
        else
        {
            amrex::average_down(a[mglev-1], a[mglev], 0, 1, ratio);
        }

        Vector<const MultiFab*> fine {AMREX_D_DECL(&(b[mglev-1][0]),
                                                   &(b[mglev-1][1]),
                                                   &(b[mglev-1][2]))};
        Vector<MultiFab*> crse {AMREX_D_DECL(&(b[mglev][0]),
                                             &(b[mglev][1]),
                                             &(b[mglev][2]))};

        amrex::average_down_faces(fine, crse, ratio, 0);
    }

    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        if (m_overset_mask[amrlev][mglev]) {
            const Real fac = static_cast<Real>(1 << mglev); // 2**mglev
            const Real osfac = Real(2.0)*fac/(fac+Real(1.0));
            const int ncomp = getNComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(a[mglev],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(Box const& xbx = mfi.nodaltilebox(0);,
                             Box const& ybx = mfi.nodaltilebox(1);,
                             Box const& zbx = mfi.nodaltilebox(2));
                AMREX_D_TERM(Array4<Real> const& bx = b[mglev][0].array(mfi);,
                             Array4<Real> const& by = b[mglev][1].array(mfi);,
                             Array4<Real> const& bz = b[mglev][2].array(mfi));
                Array4<int const> const& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, t_xbx,
                     {
                         overset_rescale_bcoef_x(t_xbx, bx, osm, ncomp, osfac);
                     },
                     ybx, t_ybx,
                     {
                         overset_rescale_bcoef_y(t_ybx, by, osm, ncomp, osfac);
                     },
                     zbx, t_zbx,
                     {
                         overset_rescale_bcoef_z(t_zbx, bz, osm, ncomp, osfac);
                     });
            }
        }
    }
}